

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

bool __thiscall
SQCompilation::CodegenVisitor::IsLocalConstant(CodegenVisitor *this,SQObject *name,SQObject *e)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectPtr *pSVar3;
  SQTable *this_00;
  long lVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  SQObjectPtr val;
  SQObjectPtr local_68;
  SQObject local_58;
  SQObject *local_40;
  SQObject *local_38;
  
  local_58._unVal.pTable = (SQTable *)0x0;
  local_58._type = OT_NULL;
  local_58._flags = '\0';
  local_58._5_3_ = 0;
  uVar7 = (ulong)(this->_scopedconsts)._size;
  bVar10 = uVar7 != 0;
  local_40 = e;
  local_38 = name;
  if (bVar10) {
    lVar8 = uVar7 + 1;
    do {
      uVar6 = (int)lVar8 - 2;
      pSVar3 = (this->_scopedconsts)._vals;
      SVar2 = pSVar3[uVar6].super_SQObject._type;
      if (SVar2 == OT_NULL) {
        bVar5 = false;
      }
      else {
        this_00 = pSVar3[uVar6].super_SQObject._unVal.pTable;
        local_68.super_SQObject._type = local_38->_type;
        local_68.super_SQObject._flags = local_38->_flags;
        local_68.super_SQObject._5_3_ = *(undefined3 *)&local_38->field_0x5;
        local_68.super_SQObject._unVal = (SQObjectValue)(local_38->_unVal).pTable;
        if ((local_68.super_SQObject._0_8_ & 0x8000000) != 0) {
          pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        bVar5 = SQTable::Get(this_00,&local_68,(SQObjectPtr *)&local_58);
      }
      if (SVar2 != OT_NULL) {
        SQObjectPtr::~SQObjectPtr(&local_68);
      }
      if (bVar5 != false) {
        local_40->_type = local_58._type;
        local_40->_flags = local_58._flags;
        *(undefined3 *)&local_40->field_0x5 = local_58._5_3_;
        local_40->_unVal = local_58._unVal;
        if ((pSVar3[uVar6].super_SQObject._flags & 1) != 0) {
          local_40->_flags = local_40->_flags | 1;
        }
        if (bVar5 != false) break;
      }
      lVar9 = lVar8 + -1;
      lVar4 = lVar8 + -3;
      bVar10 = 1 < lVar9;
      lVar8 = lVar9;
    } while (SBORROW8(lVar9,2) == lVar4 < 0);
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_58);
  return bVar10;
}

Assistant:

bool CodegenVisitor::IsLocalConstant(const SQObject &name, SQObject &e)
{
    SQObjectPtr val;
    for (SQInteger i = SQInteger(_scopedconsts.size()) - 1; i >= 0; --i) {
        SQObjectPtr &tbl = _scopedconsts[i];
        if (!sq_isnull(tbl) && _table(tbl)->Get(name, val)) {
            e = val;
            if (tbl._flags & SQOBJ_FLAG_IMMUTABLE)
                e._flags |= SQOBJ_FLAG_IMMUTABLE;
            return true;
        }
    }
    return false;
}